

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

int parse_destination_token(Context *ctx,DestArgInfo *info)

{
  int iVar1;
  uint uVar2;
  RegisterType rtype;
  char *reason;
  uint uVar3;
  
  if (ctx->tokencount == 0) {
    fail(ctx,"Out of tokens in destination parameter");
    return 0;
  }
  uVar2 = *ctx->tokens;
  info->token = ctx->tokens;
  info->regnum = uVar2 & 0x7ff;
  info->relative = uVar2 >> 0xd & 1;
  uVar3 = uVar2 >> 0x10 & 0xf;
  info->orig_writemask = uVar3;
  info->result_mod = uVar2 >> 0x14 & 0xf;
  info->result_shift = uVar2 >> 0x18 & 0xf;
  rtype = uVar2 >> 8 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT) | uVar2 >> 0x1c & REG_TYPE_CONSTINT;
  info->regtype = rtype;
  iVar1 = isscalar(ctx,ctx->shader_type,rtype,uVar2 & 0x7ff);
  if (iVar1 != 0) {
    uVar3 = 1;
  }
  set_dstarg_writemask(info,uVar3);
  uVar3 = info->regtype - REG_TYPE_CONST2;
  if (uVar3 < 3) {
    info->regtype = REG_TYPE_CONST;
    info->regnum = uVar3 * 0x800 + info->regnum + 0x800;
  }
  ctx->tokens = ctx->tokens + 1;
  ctx->tokencount = ctx->tokencount - 1;
  ctx->current_position = ctx->current_position + 4;
  if ((uVar2 & 0xc000) != 0) {
    fail(ctx,"Reserved bit #1 in destination token must be zero");
  }
  if (-1 < (int)uVar2) {
    fail(ctx,"Reserved bit #2 in destination token must be one");
  }
  if (info->relative != 0) {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      fail(ctx,"Relative addressing in non-vertex shader");
    }
    iVar1 = shader_version_atleast(ctx,'\x03','\0');
    if (iVar1 == 0) {
      fail(ctx,"Relative addressing in vertex shader version < 3.0");
    }
    if (((ctx->ctab).have_ctab == 0) && (ctx->ignores_ctab == 0)) {
      fail(ctx,"relative addressing unsupported without a CTAB");
    }
    fail(ctx,"Relative addressing of dest tokens is unsupported");
    return 2;
  }
  uVar2 = info->result_shift;
  if (uVar2 != 0) {
    if (ctx->shader_type != MOJOSHADER_TYPE_PIXEL) {
      fail(ctx,"Result shift scale in non-pixel shader");
    }
    iVar1 = shader_version_atleast(ctx,'\x02','\0');
    if (iVar1 != 0) {
      fail(ctx,"Result shift scale in pixel shader version >= 2.0");
    }
    if ((0xf < uVar2) || ((0xe00eU >> (uVar2 & 0x1f) & 1) == 0)) {
      fail(ctx,"Result shift scale isn\'t 1 to 3, or 13 to 15.");
    }
  }
  uVar2 = info->result_mod;
  if (((uVar2 & 2) != 0) && (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)) {
    fail(ctx,"Partial precision result mod in non-pixel shader");
    uVar2 = info->result_mod;
  }
  if ((uVar2 & 4) != 0) {
    if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
      if (ctx->centroid_allowed != 0) goto LAB_0011b019;
      reason = "Centroid modifier not allowed here";
    }
    else {
      reason = "Centroid result mod in non-pixel shader";
    }
    fail(ctx,reason);
  }
LAB_0011b019:
  if (REG_TYPE_MAX < info->regtype) {
    fail(ctx,"Register type is out of range");
  }
  if (ctx->isfail == 0) {
    set_used_register(ctx,info->regtype,info->regnum,1);
  }
  return 1;
}

Assistant:

static int parse_destination_token(Context *ctx, DestArgInfo *info)
{
    // !!! FIXME: recheck against the spec for ranges (like RASTOUT values, etc).
    if (ctx->tokencount == 0)
    {
        fail(ctx, "Out of tokens in destination parameter");
        return 0;
    } // if

    const uint32 token = SWAP32(*(ctx->tokens));
    const int reserved1 = (int) ((token >> 14) & 0x3); // bits 14 through 15
    const int reserved2 = (int) ((token >> 31) & 0x1); // bit 31

    info->token = ctx->tokens;
    info->regnum = (int) (token & 0x7ff);  // bits 0 through 10
    info->relative = (int) ((token >> 13) & 0x1); // bit 13
    info->orig_writemask = (int) ((token >> 16) & 0xF); // bits 16 through 19
    info->result_mod = (int) ((token >> 20) & 0xF); // bits 20 through 23
    info->result_shift = (int) ((token >> 24) & 0xF); // bits 24 through 27      abc
    info->regtype = (RegisterType) (((token >> 28) & 0x7) | ((token >> 8) & 0x18));  // bits 28-30, 11-12

    int writemask;
    if (isscalar(ctx, ctx->shader_type, info->regtype, info->regnum))
        writemask = 0x1;  // just x.
    else
        writemask = info->orig_writemask;

    set_dstarg_writemask(info, writemask);  // bits 16 through 19.

    // all the REG_TYPE_CONSTx types are the same register type, it's just
    //  split up so its regnum can be > 2047 in the bytecode. Clean it up.
    if (info->regtype == REG_TYPE_CONST2)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 2048;
    } // else if
    else if (info->regtype == REG_TYPE_CONST3)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 4096;
    } // else if
    else if (info->regtype == REG_TYPE_CONST4)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 6144;
    } // else if

    // swallow token for now, for multiple calls in a row.
    adjust_token_position(ctx, 1);

    if (reserved1 != 0x0)
        fail(ctx, "Reserved bit #1 in destination token must be zero");

    if (reserved2 != 0x1)
        fail(ctx, "Reserved bit #2 in destination token must be one");

    if (info->relative)
    {
        if (!shader_is_vertex(ctx))
            fail(ctx, "Relative addressing in non-vertex shader");
        if (!shader_version_atleast(ctx, 3, 0))
            fail(ctx, "Relative addressing in vertex shader version < 3.0");
        if ((!ctx->ctab.have_ctab) && (!ctx->ignores_ctab))
        {
            // it's hard to do this efficiently without!
            fail(ctx, "relative addressing unsupported without a CTAB");
        } // if

        // !!! FIXME: I don't have a shader that has a relative dest currently.
        fail(ctx, "Relative addressing of dest tokens is unsupported");
        return 2;
    } // if

    const int s = info->result_shift;
    if (s != 0)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Result shift scale in non-pixel shader");
        if (shader_version_atleast(ctx, 2, 0))
            fail(ctx, "Result shift scale in pixel shader version >= 2.0");
        if ( ! (((s >= 1) && (s <= 3)) || ((s >= 0xD) && (s <= 0xF))) )
            fail(ctx, "Result shift scale isn't 1 to 3, or 13 to 15.");
    } // if

    if (info->result_mod & MOD_PP)  // Partial precision (pixel shaders only)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Partial precision result mod in non-pixel shader");
    } // if

    if (info->result_mod & MOD_CENTROID)  // Centroid (pixel shaders only)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Centroid result mod in non-pixel shader");
        else if (!ctx->centroid_allowed)  // only on DCL opcodes!
            fail(ctx, "Centroid modifier not allowed here");
    } // if

    if (/*(info->regtype < 0) ||*/ (info->regtype > REG_TYPE_MAX))
        fail(ctx, "Register type is out of range");

    if (!isfail(ctx))
        set_used_register(ctx, info->regtype, info->regnum, 1);

    return 1;
}